

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotStemsEx<ImPlot::GetterYs<unsigned_short>,ImPlot::GetterYRef>
               (char *label_id,GetterYs<unsigned_short> *get_mark,GetterYRef *get_base)

{
  ImVec2 IVar1;
  undefined8 uVar2;
  TransformerLogLog transformer;
  int iVar3;
  ImPlotPlot *pIVar4;
  bool bVar5;
  ImU32 IVar6;
  ImU32 col_mk_fill;
  ImDrawList *DrawList;
  ImPlotContext *pIVar7;
  int iVar8;
  unsigned_short *puVar9;
  double dVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  unsigned_short *puVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  double dVar17;
  ImPlotPoint local_c8;
  ImPlotContext *local_b8;
  ulong local_b0;
  ulong local_a8;
  long local_a0;
  unsigned_short *local_98;
  ulong local_90;
  double local_88;
  uint local_7c;
  undefined1 local_78 [16];
  double local_68;
  undefined8 uStack_60;
  unsigned_short *local_58;
  double dStack_50;
  unsigned_short *local_48;
  undefined8 uStack_40;
  
  bVar5 = BeginItem(label_id,0);
  if (bVar5) {
    if ((GImPlot->FitThisFrame == true) && (0 < get_base->Count)) {
      iVar8 = 0;
      do {
        local_b8 = (ImPlotContext *)(double)iVar8;
        local_c8.x = get_mark->XScale * (double)local_b8 + get_mark->X0;
        iVar11 = get_mark->Count;
        local_c8.y = (double)*(ushort *)
                              ((long)get_mark->Ys +
                              (long)(((get_mark->Offset + iVar8) % iVar11 + iVar11) % iVar11) *
                              (long)get_mark->Stride);
        FitPoint(&local_c8);
        local_c8.x = (double)local_b8 * get_base->XScale + get_base->X0;
        local_c8.y = get_base->YRef;
        FitPoint(&local_c8);
        iVar8 = iVar8 + 1;
      } while (iVar8 < get_base->Count);
    }
    pIVar7 = GImPlot;
    DrawList = GetPlotDrawList();
    if ((pIVar7->NextItemData).RenderLine == true) {
      IVar6 = ImGui::GetColorU32((pIVar7->NextItemData).Colors);
      iVar8 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar8]) {
      case 0:
        local_c8.x = (double)CONCAT44(local_c8.x._4_4_,iVar8);
        RenderLineSegments<ImPlot::GetterYs<unsigned_short>,ImPlot::GetterYRef,ImPlot::TransformerLinLin>
                  (get_mark,get_base,(TransformerLinLin *)&local_c8,DrawList,
                   (pIVar7->NextItemData).LineWeight,IVar6);
        break;
      case 1:
        local_c8.x = (double)CONCAT44(local_c8.x._4_4_,iVar8);
        RenderLineSegments<ImPlot::GetterYs<unsigned_short>,ImPlot::GetterYRef,ImPlot::TransformerLogLin>
                  (get_mark,get_base,(TransformerLogLin *)&local_c8,DrawList,
                   (pIVar7->NextItemData).LineWeight,IVar6);
        break;
      case 2:
        local_c8.x = (double)CONCAT44(local_c8.x._4_4_,iVar8);
        RenderLineSegments<ImPlot::GetterYs<unsigned_short>,ImPlot::GetterYRef,ImPlot::TransformerLinLog>
                  (get_mark,get_base,(TransformerLinLog *)&local_c8,DrawList,
                   (pIVar7->NextItemData).LineWeight,IVar6);
        break;
      case 3:
        local_c8.x = (double)CONCAT44(local_c8.x._4_4_,iVar8);
        RenderLineSegments<ImPlot::GetterYs<unsigned_short>,ImPlot::GetterYRef,ImPlot::TransformerLogLog>
                  (get_mark,get_base,(TransformerLogLog *)&local_c8,DrawList,
                   (pIVar7->NextItemData).LineWeight,IVar6);
      }
    }
    iVar8 = (pIVar7->NextItemData).Marker;
    iVar11 = 0;
    if (iVar8 != -1) {
      iVar11 = iVar8;
    }
    IVar6 = ImGui::GetColorU32((pIVar7->NextItemData).Colors + 2);
    col_mk_fill = ImGui::GetColorU32((pIVar7->NextItemData).Colors + 3);
    transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
    local_b8 = GImPlot;
    switch(GImPlot->Scales[transformer.YAxis]) {
    case 0:
      iVar8 = get_mark->Count;
      if (0 < iVar8) {
        puVar9 = get_mark->Ys;
        puVar14 = (unsigned_short *)get_mark->XScale;
        local_58 = (unsigned_short *)get_mark->X0;
        uVar15 = SUB84(local_58,0);
        uVar16 = (undefined4)((ulong)local_58 >> 0x20);
        dVar10 = (double)(ulong)(uint)get_mark->Offset;
        local_88 = (double)CONCAT44(local_88._4_4_,(pIVar7->NextItemData).MarkerSize);
        local_90 = CONCAT44(local_90._4_4_,(pIVar7->NextItemData).MarkerWeight);
        iVar3 = get_mark->Stride;
        local_a0 = (long)iVar11;
        iVar11 = 0;
        dVar17 = 0.0;
        local_a8 = CONCAT44(local_a8._4_4_,(uint)(pIVar7->NextItemData).RenderMarkerLine);
        local_b0 = CONCAT44(local_b0._4_4_,(uint)(pIVar7->NextItemData).RenderMarkerFill);
        pIVar7 = GImPlot;
        local_98 = puVar9;
        local_68 = dVar10;
        local_48 = puVar14;
        do {
          IVar1 = pIVar7->PixelRange[transformer.YAxis].Min;
          fVar12 = (float)(pIVar7->Mx *
                           (((double)puVar14 * dVar17 + (double)CONCAT44(uVar16,uVar15)) -
                           (pIVar7->CurrentPlot->XAxis).Range.Min) + (double)IVar1.x);
          fVar13 = (float)(pIVar7->My[transformer.YAxis] *
                           ((double)*(ushort *)
                                     ((long)puVar9 +
                                     (long)(((SUB84(dVar10,0) + iVar11) % iVar8 + iVar8) % iVar8) *
                                     (long)iVar3) -
                           pIVar7->CurrentPlot->YAxis[transformer.YAxis].Range.Min) +
                          (double)IVar1.y);
          local_c8.x = (double)CONCAT44(fVar13,fVar12);
          pIVar4 = local_b8->CurrentPlot;
          if ((((pIVar4->PlotRect).Min.x <= fVar12) && ((pIVar4->PlotRect).Min.y <= fVar13)) &&
             ((fVar12 < (pIVar4->PlotRect).Max.x && (fVar13 < (pIVar4->PlotRect).Max.y)))) {
            local_78._0_8_ = dVar17;
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterYs<unsigned_short>>(ImPlot::GetterYs<unsigned_short>,ImPlot::TransformerLinLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_a0 * 8))
                      (local_88._0_4_,(undefined4)local_90,DrawList,&local_c8,local_a8 & 0xffffffff,
                       IVar6,local_b0 & 0xffffffff,col_mk_fill);
            uVar15 = SUB84(local_58,0);
            uVar16 = (undefined4)((ulong)local_58 >> 0x20);
            pIVar7 = GImPlot;
            puVar9 = local_98;
            dVar10 = local_68;
            puVar14 = local_48;
            dVar17 = (double)local_78._0_8_;
          }
          dVar17 = dVar17 + 1.0;
          iVar11 = iVar11 + 1;
        } while (iVar8 != iVar11);
      }
      break;
    case 1:
      iVar8 = get_mark->Count;
      if (0 < iVar8) {
        local_58 = get_mark->Ys;
        local_68 = get_mark->XScale;
        local_88 = get_mark->X0;
        local_90 = (ulong)(uint)get_mark->Offset;
        local_a0 = CONCAT44(local_a0._4_4_,(pIVar7->NextItemData).MarkerSize);
        local_a8 = CONCAT44(local_a8._4_4_,(pIVar7->NextItemData).MarkerWeight);
        local_98 = (unsigned_short *)(long)get_mark->Stride;
        local_b0 = (ulong)iVar11;
        iVar11 = 0;
        dVar10 = 0.0;
        bVar5 = (pIVar7->NextItemData).RenderMarkerLine;
        local_7c = (uint)(pIVar7->NextItemData).RenderMarkerFill;
        do {
          pIVar7 = GImPlot;
          local_78._0_8_ = dVar10;
          local_48 = (unsigned_short *)
                     (double)*(ushort *)
                              ((long)local_58 +
                              (long)((((int)local_90 + iVar11) % iVar8 + iVar8) % iVar8) *
                              (long)local_98);
          uStack_40 = 0;
          dVar10 = log10((local_68 * dVar10 + local_88) / (GImPlot->CurrentPlot->XAxis).Range.Min);
          pIVar4 = pIVar7->CurrentPlot;
          dVar17 = (pIVar4->XAxis).Range.Min;
          IVar1 = pIVar7->PixelRange[transformer.YAxis].Min;
          fVar12 = (float)(pIVar7->Mx *
                           (((double)(float)(dVar10 / pIVar7->LogDenX) *
                             ((pIVar4->XAxis).Range.Max - dVar17) + dVar17) - dVar17) +
                          (double)IVar1.x);
          fVar13 = (float)(pIVar7->My[transformer.YAxis] *
                           ((double)local_48 - pIVar4->YAxis[transformer.YAxis].Range.Min) +
                          (double)IVar1.y);
          local_c8.x = (double)CONCAT44(fVar13,fVar12);
          pIVar4 = local_b8->CurrentPlot;
          if ((((pIVar4->PlotRect).Min.x <= fVar12) && ((pIVar4->PlotRect).Min.y <= fVar13)) &&
             ((fVar12 < (pIVar4->PlotRect).Max.x && (fVar13 < (pIVar4->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterYs<unsigned_short>>(ImPlot::GetterYs<unsigned_short>,ImPlot::TransformerLogLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_b0 * 8))
                      ((undefined4)local_a0,(undefined4)local_a8,DrawList,&local_c8,bVar5,IVar6,
                       local_7c,col_mk_fill);
          }
          dVar10 = (double)local_78._0_8_ + 1.0;
          iVar11 = iVar11 + 1;
        } while (iVar8 != iVar11);
      }
      break;
    case 2:
      iVar8 = get_mark->Count;
      if (0 < iVar8) {
        local_48 = get_mark->Ys;
        local_58 = (unsigned_short *)get_mark->XScale;
        dStack_50 = get_mark->X0;
        local_68 = get_mark->X0;
        uStack_60._0_4_ = get_mark->Offset;
        uStack_60._4_4_ = get_mark->Stride;
        local_88 = (double)(ulong)(uint)get_mark->Offset;
        local_98 = (unsigned_short *)CONCAT44(local_98._4_4_,(pIVar7->NextItemData).MarkerSize);
        local_a0 = CONCAT44(local_a0._4_4_,(pIVar7->NextItemData).MarkerWeight);
        local_90 = (ulong)get_mark->Stride;
        local_a8 = (ulong)iVar11;
        iVar11 = 0;
        dVar10 = 0.0;
        local_78._8_4_ = 0;
        local_78._12_4_ = 0;
        local_b0 = CONCAT44(local_b0._4_4_,(uint)(pIVar7->NextItemData).RenderMarkerLine);
        bVar5 = (pIVar7->NextItemData).RenderMarkerFill;
        do {
          pIVar7 = GImPlot;
          local_78._0_8_ = dVar10;
          dVar17 = log10((double)*(ushort *)
                                  ((long)local_48 +
                                  (long)(((SUB84(local_88,0) + iVar11) % iVar8 + iVar8) % iVar8) *
                                  local_90) /
                         GImPlot->CurrentPlot->YAxis[transformer.YAxis].Range.Min);
          pIVar4 = pIVar7->CurrentPlot;
          dVar10 = pIVar4->YAxis[transformer.YAxis].Range.Min;
          IVar1 = pIVar7->PixelRange[transformer.YAxis].Min;
          fVar12 = (float)(pIVar7->Mx *
                           ((local_68 + local_78._0_8_ * (double)local_58) -
                           (pIVar4->XAxis).Range.Min) + (double)IVar1.x);
          fVar13 = (float)(pIVar7->My[transformer.YAxis] *
                           ((dVar10 + (double)(float)(dVar17 / pIVar7->LogDenY[transformer.YAxis]) *
                                      (pIVar4->YAxis[transformer.YAxis].Range.Max - dVar10)) -
                           dVar10) + (double)IVar1.y);
          local_c8.x = (double)CONCAT44(fVar13,fVar12);
          pIVar4 = local_b8->CurrentPlot;
          if (((((pIVar4->PlotRect).Min.x <= fVar12) &&
               (uVar2 = *(undefined8 *)&(pIVar4->PlotRect).Min.y, (float)uVar2 <= fVar13)) &&
              (fVar12 < (float)((ulong)uVar2 >> 0x20))) && (fVar13 < (pIVar4->PlotRect).Max.y)) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterYs<unsigned_short>>(ImPlot::GetterYs<unsigned_short>,ImPlot::TransformerLinLog,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_a8 * 8))
                      (local_98._0_4_,(undefined4)local_a0,DrawList,&local_c8,local_b0 & 0xffffffff,
                       IVar6,bVar5,col_mk_fill);
          }
          dVar10 = (double)CONCAT44(local_78._4_4_,local_78._0_4_) + 1.0;
          iVar11 = iVar11 + 1;
        } while (iVar8 != iVar11);
      }
      break;
    case 3:
      RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterYs<unsigned_short>>
                (*get_mark,transformer,DrawList,iVar11,(pIVar7->NextItemData).MarkerSize,
                 (pIVar7->NextItemData).RenderMarkerLine,IVar6,(pIVar7->NextItemData).MarkerWeight,
                 (pIVar7->NextItemData).RenderMarkerFill,col_mk_fill);
    }
    pIVar7 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar7->NextItemData);
    pIVar7->PreviousItem = pIVar7->CurrentItem;
    pIVar7->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotStemsEx(const char* label_id, const GetterM& get_mark, const GetterB& get_base) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        if (FitThisFrame()) {
            for (int i = 0; i < get_base.Count; ++i) {
                FitPoint(get_mark(i));
                FitPoint(get_base(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render stems
        if (s.RenderLine) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineSegments(get_mark, get_base, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineSegments(get_mark, get_base, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineSegments(get_mark, get_base, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineSegments(get_mark, get_base, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        // render markers
        ImPlotMarker marker = s.Marker == ImPlotMarker_None ? ImPlotMarker_Circle : s.Marker;
        if (marker != ImPlotMarker_None) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(get_mark, TransformerLinLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(get_mark, TransformerLogLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(get_mark, TransformerLinLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(get_mark, TransformerLogLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}